

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5ExprNodeFirst(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5IndexIter **ppFVar1;
  Fts5ExprNearset *pFVar2;
  Fts5ExprPhrase *pFVar3;
  Fts5Index *p;
  char *__s;
  Fts5ExprNode *pNode_00;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  int iVar8;
  Fts5ExprTerm *pFVar9;
  long lVar10;
  
  pNode->bEof = 0;
  pNode->bNomatch = 0;
  if ((pNode->eType == 9) || (pNode->eType == 4)) {
    pFVar2 = pNode->pNear;
    for (lVar7 = 0; lVar7 < pFVar2->nPhrase; lVar7 = lVar7 + 1) {
      pFVar3 = pFVar2->apPhrase[lVar7];
      if (pFVar3->nTerm == 0) {
LAB_0018e1ff:
        iVar5 = 1;
        goto LAB_0018e206;
      }
      lVar10 = 0;
      while (lVar10 < pFVar3->nTerm) {
        bVar4 = false;
        pFVar9 = pFVar3->aTerm + lVar10;
        while (pFVar9 != (Fts5ExprTerm *)0x0) {
          if (pFVar9->pIter != (Fts5IndexIter *)0x0) {
            sqlite3Fts5IterClose(pFVar9->pIter);
            pFVar9->pIter = (Fts5IndexIter *)0x0;
          }
          p = pExpr->pIndex;
          __s = pFVar9->zTerm;
          sVar6 = strlen(__s);
          iVar5 = sqlite3Fts5IndexQuery
                            (p,__s,(int)sVar6,
                             (uint)(pFVar3->aTerm[lVar10].bPrefix != '\0') +
                             (uint)(pExpr->bDesc != 0) * 2,pFVar2->pColset,&pFVar9->pIter);
          if (iVar5 != 0) {
            return iVar5;
          }
          ppFVar1 = &pFVar9->pIter;
          pFVar9 = pFVar9->pSynonym;
          if ((*ppFVar1)->bEof == '\0') {
            bVar4 = true;
          }
        }
        lVar10 = lVar10 + 1;
        if (!bVar4) goto LAB_0018e1ff;
      }
    }
    iVar5 = 0;
LAB_0018e206:
    pNode->bEof = iVar5;
    goto LAB_0018e20a;
  }
  if (pNode->xNext == (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0) {
    pNode->bEof = 1;
    return 0;
  }
  lVar7 = 0;
  iVar8 = 0;
  iVar5 = 0;
  while ((lVar7 < pNode->nChild && (iVar5 == 0))) {
    pNode_00 = pNode->apChild[lVar7];
    iVar5 = fts5ExprNodeFirst(pExpr,pNode_00);
    iVar8 = iVar8 + pNode_00->bEof;
    lVar7 = lVar7 + 1;
  }
  pNode->iRowid = pNode->apChild[0]->iRowid;
  if (pNode->eType == 1) {
    if (pNode->nChild == iVar8) {
LAB_0018e1e0:
      fts5ExprSetEof(pNode);
    }
  }
  else if (pNode->eType == 2) {
    if (0 < iVar8) goto LAB_0018e1e0;
  }
  else {
    pNode->bEof = pNode->apChild[0]->bEof;
  }
  if (iVar5 != 0) {
    return iVar5;
  }
  iVar5 = pNode->bEof;
LAB_0018e20a:
  if (iVar5 == 0) {
    switch(pNode->eType) {
    case 1:
      fts5ExprNodeTest_OR(pExpr,pNode);
      break;
    case 2:
      iVar5 = fts5ExprNodeTest_AND(pExpr,pNode);
      return iVar5;
    default:
      iVar5 = fts5ExprNodeTest_NOT(pExpr,pNode);
      return iVar5;
    case 4:
      fts5ExprNodeTest_TERM(pExpr,pNode);
      break;
    case 9:
      iVar5 = fts5ExprNodeTest_STRING(pExpr,pNode);
      return iVar5;
    }
  }
  return 0;
}

Assistant:

static int fts5ExprNodeFirst(Fts5Expr *pExpr, Fts5ExprNode *pNode){
  int rc = SQLITE_OK;
  pNode->bEof = 0;
  pNode->bNomatch = 0;

  if( Fts5NodeIsString(pNode) ){
    /* Initialize all term iterators in the NEAR object. */
    rc = fts5ExprNearInitAll(pExpr, pNode);
  }else if( pNode->xNext==0 ){
    pNode->bEof = 1;
  }else{
    int i;
    int nEof = 0;
    for(i=0; i<pNode->nChild && rc==SQLITE_OK; i++){
      Fts5ExprNode *pChild = pNode->apChild[i];
      rc = fts5ExprNodeFirst(pExpr, pNode->apChild[i]);
      assert( pChild->bEof==0 || pChild->bEof==1 );
      nEof += pChild->bEof;
    }
    pNode->iRowid = pNode->apChild[0]->iRowid;

    switch( pNode->eType ){
      case FTS5_AND:
        if( nEof>0 ) fts5ExprSetEof(pNode);
        break;

      case FTS5_OR:
        if( pNode->nChild==nEof ) fts5ExprSetEof(pNode);
        break;

      default:
        assert( pNode->eType==FTS5_NOT );
        pNode->bEof = pNode->apChild[0]->bEof;
        break;
    }
  }

  if( rc==SQLITE_OK ){
    rc = fts5ExprNodeTest(pExpr, pNode);
  }
  return rc;
}